

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_gzip_external(CImg<unsigned_char> *this,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  int iVar6;
  CImgIOException *pCVar7;
  char *pcVar8;
  char *pcVar9;
  FILE *pFVar10;
  ulong uVar11;
  char *pcVar12;
  CImg<char> *pCVar13;
  char *pcVar14;
  cimg *this_00;
  CImg<char> local_e8;
  CImg<char> local_c8;
  FILE *local_a8;
  FILE *file;
  char *ext2;
  char *ext;
  CImg<char> body;
  CImg<char> filename_tmp;
  CImg<char> command;
  char *filename_local;
  CImg<unsigned_char> *this_local;
  
  if (filename == (char *)0x0) {
    pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar5 = this->_data;
    pcVar8 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar8 = "";
    }
    pcVar9 = pixel_type();
    CImgIOException::CImgIOException
              (pCVar7,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_gzip_external(): Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar8,pcVar9);
    __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  pFVar10 = cimg::fopen(filename,"rb");
  fclose(pFVar10);
  CImg<char>::CImg((CImg<char> *)&filename_tmp._data,0x400,1,1,1);
  CImg<char>::CImg((CImg<char> *)&body._data,0x100,1,1,1);
  CImg<char>::CImg((CImg<char> *)&ext,0x100,1,1,1);
  pcVar8 = cimg_library::CImg::operator_cast_to_char_((CImg *)&ext);
  ext2 = cimg::split_filename(filename,pcVar8);
  pcVar8 = cimg_library::CImg::operator_cast_to_char_((CImg *)&ext);
  file = (FILE *)cimg::split_filename(pcVar8,(char *)0x0);
  local_a8 = (FILE *)0x0;
  do {
    iVar6 = cimg::strcasecmp(ext2,"gz");
    if (iVar6 == 0) {
      if (*file == (FILE)0x0) {
        pcVar8 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
        uVar11 = (ulong)(uint)body._data;
        pcVar9 = cimg::temporary_path((char *)0x0,false);
        pcVar12 = cimg::filenamerand();
        snprintf(pcVar8,uVar11,"%s%c%s",pcVar9,0x2f,pcVar12);
      }
      else {
        pcVar8 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
        uVar11 = (ulong)(uint)body._data;
        pcVar9 = cimg::temporary_path((char *)0x0,false);
        pcVar12 = cimg::filenamerand();
        snprintf(pcVar8,uVar11,"%s%c%s.%s",pcVar9,0x2f,pcVar12,file);
      }
    }
    else if (*ext2 == '\0') {
      pcVar8 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
      uVar11 = (ulong)(uint)body._data;
      pcVar9 = cimg::temporary_path((char *)0x0,false);
      pcVar12 = cimg::filenamerand();
      snprintf(pcVar8,uVar11,"%s%c%s",pcVar9,0x2f,pcVar12);
    }
    else {
      pcVar8 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
      uVar11 = (ulong)(uint)body._data;
      pcVar9 = cimg::temporary_path((char *)0x0,false);
      pcVar12 = cimg::filenamerand();
      snprintf(pcVar8,uVar11,"%s%c%s.%s",pcVar9,0x2f,pcVar12,ext2);
    }
    pcVar8 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
    local_a8 = fopen(pcVar8,"rb");
    if (local_a8 != (FILE *)0x0) {
      cimg::fclose(local_a8);
    }
  } while (local_a8 != (FILE *)0x0);
  pcVar8 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  pcVar9 = cimg::gunzip_path((char *)0x0,false);
  CImg<char>::string(&local_c8,filename,true,false);
  pCVar13 = CImg<char>::_system_strescape(&local_c8);
  pcVar12 = CImg<char>::data(pCVar13);
  pcVar14 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
  CImg<char>::string(&local_e8,pcVar14,true,false);
  pCVar13 = CImg<char>::_system_strescape(&local_e8);
  pcVar14 = CImg<char>::data(pCVar13);
  snprintf(pcVar8,(ulong)(uint)filename_tmp._data,"%s -c \"%s\" > \"%s\"",pcVar9,pcVar12,pcVar14);
  CImg<char>::~CImg(&local_e8);
  CImg<char>::~CImg(&local_c8);
  this_00 = (cimg *)cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  cimg::system(this_00,(char *)0x0);
  pcVar8 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
  local_a8 = fopen(pcVar8,"rb");
  if (local_a8 != (FILE *)0x0) {
    cimg::fclose(local_a8);
    pcVar8 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
    load(this,pcVar8);
    pcVar8 = cimg_library::CImg::operator_cast_to_char_((CImg *)&body._data);
    remove(pcVar8);
    CImg<char>::~CImg((CImg<char> *)&ext);
    CImg<char>::~CImg((CImg<char> *)&body._data);
    CImg<char>::~CImg((CImg<char> *)&filename_tmp._data);
    return this;
  }
  pFVar10 = cimg::fopen(filename,"r");
  cimg::fclose(pFVar10);
  pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
  uVar1 = this->_width;
  uVar2 = this->_height;
  uVar3 = this->_depth;
  uVar4 = this->_spectrum;
  puVar5 = this->_data;
  pcVar8 = "non-";
  if ((this->_is_shared & 1U) != 0) {
    pcVar8 = "";
  }
  pcVar9 = pixel_type();
  CImgIOException::CImgIOException
            (pCVar7,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_gzip_external(): Failed to load file \'%s\' with external command \'gunzip\'."
             ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar8,pcVar9,filename);
  __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
}

Assistant:

CImg<T>& load_gzip_external(const char *const filename) {
      if (!filename)
        throw CImgIOException(_cimg_instance
                              "load_gzip_external(): Specified filename is (null).",
                              cimg_instance);
      std::fclose(cimg::fopen(filename,"rb"));            // Check if file exists.
      CImg<charT> command(1024), filename_tmp(256), body(256);
      const char
        *const ext = cimg::split_filename(filename,body),
        *const ext2 = cimg::split_filename(body,0);

      std::FILE *file = 0;
      do {
        if (!cimg::strcasecmp(ext,"gz")) {
          if (*ext2) cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.%s",
                                   cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),ext2);
          else cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s",
                             cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        } else {
          if (*ext) cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.%s",
                                  cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),ext);
          else cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s",
                             cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        }
        if ((file=std::fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s -c \"%s\" > \"%s\"",
                    cimg::gunzip_path(),
                    CImg<charT>::string(filename)._system_strescape().data(),
                    CImg<charT>::string(filename_tmp)._system_strescape().data());
      cimg::system(command);
      if (!(file = std::fopen(filename_tmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_gzip_external(): Failed to load file '%s' with external command 'gunzip'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load(filename_tmp);
      std::remove(filename_tmp);
      return *this;
    }